

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent.cpp
# Opt level: O3

void __thiscall
ear::PolarExtent::PolarExtent
          (PolarExtent *this,shared_ptr<ear::PointSourcePanner> *psp_,
          unique_ptr<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>_> *core_impl_)

{
  VectorXd *this_00;
  double *pdVar1;
  undefined8 *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  size_t sVar4;
  extent_float_t *peVar5;
  extent_float_t *peVar6;
  double dVar7;
  undefined8 uVar8;
  Index IVar9;
  Index IVar10;
  uint uVar11;
  int iVar12;
  undefined8 *puVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  Index size;
  char *pcVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  element_type *peVar18;
  float *pfVar19;
  ulong uVar20;
  long lVar21;
  double *__ptr;
  size_t sVar22;
  size_t sVar23;
  extent_float_t *peVar24;
  ulong uVar25;
  float fVar26;
  MatrixXd panning_results;
  VectorXd elevations;
  void *res;
  VectorXd azimuths;
  void *local_130;
  long lStack_128;
  ulong local_120;
  DenseStorage<double,__1,__1,__1,_0> local_118;
  VectorXd *local_f8;
  VectorXd *local_f0;
  void *local_e8;
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> local_e0;
  undefined7 uStack_df;
  void *local_d8;
  ulong local_d0;
  extent_float_t *local_c8;
  ulong uStack_c0;
  extent_float_t *local_b8;
  long lStack_b0;
  long local_a8;
  void *local_a0;
  ulong uStack_98;
  undefined8 local_90;
  void *local_80;
  long local_78;
  undefined8 local_70;
  extent_float_t *local_68;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  long local_50;
  ulong local_48;
  extent_float_t *local_40;
  void *local_38;
  
  (this->core_impl)._M_t.
  super___uniq_ptr_impl<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>_>._M_t.
  super__Tuple_impl<0UL,_ear::PolarExtentCore_*,_std::default_delete<ear::PolarExtentCore>_>.
  super__Head_base<0UL,_ear::PolarExtentCore_*,_false>._M_head_impl =
       (core_impl_->_M_t).
       super___uniq_ptr_impl<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>_>._M_t.
       super__Tuple_impl<0UL,_ear::PolarExtentCore_*,_std::default_delete<ear::PolarExtentCore>_>.
       super__Head_base<0UL,_ear::PolarExtentCore_*,_false>._M_head_impl;
  (core_impl_->_M_t).
  super___uniq_ptr_impl<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>_>._M_t.
  super__Tuple_impl<0UL,_ear::PolarExtentCore_*,_std::default_delete<ear::PolarExtentCore>_>.
  super__Head_base<0UL,_ear::PolarExtentCore_*,_false>._M_head_impl = (PolarExtentCore *)0x0;
  peVar18 = (psp_->super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->psp).super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar18;
  p_Var3 = (psp_->super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->psp).super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var3;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
      peVar18 = (this->psp).super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  uVar11 = (*peVar18->_vptr_PointSourcePanner[1])();
  this_00 = &this->pvsMin;
  (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
       (double *)0x0;
  (this->pvsMin).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0
  ;
  if (-1 < (int)uVar11) {
    local_f0 = this_00;
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
              ((DenseStorage<double,__1,__1,_1,_0> *)this_00,(ulong)uVar11,(ulong)uVar11,1);
    uVar11 = (*((this->psp).super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->_vptr_PointSourcePanner[1])();
    local_f8 = &this->pvsMax;
    (local_f8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
         (double *)0x0;
    (this->pvsMax).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         0;
    if (-1 < (int)uVar11) {
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                ((DenseStorage<double,__1,__1,_1,_0> *)local_f8,(ulong)uVar11,(ulong)uVar11,1);
      local_c8 = (extent_float_t *)0x25;
      local_b8 = (extent_float_t *)0xc056800000000000;
      lStack_b0 = 0x4056800000000000;
      local_a8 = 0x24;
      local_a0 = (void *)0x4014000000000000;
      uStack_98 = uStack_98 & 0xffffffffffffff00;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
                (&local_e0,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&local_c8);
      local_130 = (void *)0x0;
      lStack_128 = 0;
      __ptr = (double *)CONCAT71(uStack_df,local_e0);
      local_120 = 3;
      if (local_d8 != (void *)0x0) {
        pdVar1 = __ptr + (long)local_d8;
        local_68 = (extent_float_t *)0x0;
        uStack_60 = 0;
        uStack_5c = 0x40768000;
        do {
          local_e8 = (void *)*__ptr;
          dVar7 = cos((double)local_e8 * 0.017453292519943295);
          dVar7 = (dVar7 * 6.283185307179586) / 6.283185307179586;
          dVar7 = round((dVar7 + dVar7) * 36.0);
          iVar12 = (int)dVar7 + (uint)((int)dVar7 == 0);
          local_a8 = (long)iVar12;
          local_c8 = (extent_float_t *)(local_a8 + 1);
          local_a0 = (void *)(360.0 / (double)iVar12);
          lStack_b0 = CONCAT44(uStack_5c,uStack_60);
          local_b8 = local_68;
          uStack_98 = uStack_98 & 0xffffffffffffff00;
          if (iVar12 < -1) {
            __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CwiseNullaryOp.h"
                          ,0x4a,
                          "Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::linspaced_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                         );
          }
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
          PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_80,
                     (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)&local_c8);
          if (1 < local_78) {
            lVar17 = 0;
            uVar16 = local_120;
            do {
              dVar7 = *(double *)((long)local_80 + lVar17 * 8);
              Eigen::internal::
              conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
              ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_130,
                    lStack_128 + 1,uVar16);
              cart((Vector3d *)&local_c8,dVar7,(double)local_e8,1.0);
              if ((long)local_120 < 0 && local_130 != (void *)0x0) {
                pcVar14 = 
                "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, Level = 0]"
                ;
                goto LAB_0014441e;
              }
              if (lStack_128 < 1) {
                pcVar14 = 
                "Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
                ;
                goto LAB_001443e0;
              }
              if (local_120 != 3) {
                pcVar14 = 
                "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>]"
                ;
                goto LAB_001443ff;
              }
              puVar13 = (undefined8 *)((long)local_130 + lStack_128 * 8 + -8);
              lVar15 = 0;
              do {
                *puVar13 = (&local_c8)[lVar15];
                lVar15 = lVar15 + 1;
                puVar13 = puVar13 + lStack_128;
              } while (lVar15 != 3);
              lVar17 = lVar17 + 1;
              uVar16 = 3;
            } while (lVar17 < local_78 + -1);
          }
          free(local_80);
          __ptr = __ptr + 1;
        } while (__ptr != pdVar1);
        __ptr = (double *)CONCAT71(uStack_df,local_e0);
      }
      free(__ptr);
      local_b8 = (extent_float_t *)0x0;
      lStack_b0 = 0;
      local_c8 = (extent_float_t *)0x0;
      uStack_c0 = 0;
      local_a0 = (void *)0x0;
      uStack_98 = 0;
      local_90 = 0;
      Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>::
      construct<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>> *)&local_c8
                 ,&local_130);
      iVar12 = (*((this->psp).super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->_vptr_PointSourcePanner[1])();
      local_118.m_data = (double *)0x0;
      local_118.m_rows = 0;
      local_118.m_cols = 0;
      uVar16 = (ulong)iVar12;
      if ((long)(uStack_c0 | uVar16) < 0) {
        pcVar14 = 
        "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
        ;
LAB_0014446b:
        __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/PlainObjectBase.h"
                      ,0x115,pcVar14);
      }
      if ((uStack_c0 != 0 && iVar12 != 0) &&
         (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)uStack_c0),0) <
          (long)uVar16)) {
        puVar13 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar13 = std::random_device::_M_fini;
        __cxa_throw(puVar13,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                (&local_118,uStack_c0 * uVar16,uVar16,uStack_c0);
      if (0 < (long)uStack_c0) {
        lVar17 = 0;
        lVar15 = 0;
        do {
          if ((long)local_b8 < 0 && local_c8 != (extent_float_t *)0x0) {
            pcVar14 = 
            "Eigen::MapBase<Eigen::Block<const Eigen::Ref<const Eigen::Matrix<double, -1, -1>>, 1>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Ref<const Eigen::Matrix<double, -1, -1>>, 1>, Level = 0]"
            ;
            goto LAB_0014441e;
          }
          if (local_b8 != (extent_float_t *)0x3) {
            pcVar14 = 
            "void Eigen::PlainObjectBase<Eigen::Matrix<double, 3, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 3, 1>]"
            ;
            goto LAB_0014446b;
          }
          peVar18 = (this->psp).
                    super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          peVar24 = local_c8 + lVar15 * 2;
          local_80 = *(void **)peVar24;
          local_78 = *(long *)(peVar24 + lStack_b0 * 2);
          local_70 = *(undefined8 *)(peVar24 + lStack_b0 * 4);
          (**peVar18->_vptr_PointSourcePanner)(&local_e0,peVar18,&local_80);
          if (local_e0 == (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>)0x0) {
            __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4bc,
                          "reference_type boost::optional<Eigen::Matrix<double, -1, 1>>::get() [T = Eigen::Matrix<double, -1, 1>]"
                         );
          }
          if (local_118.m_rows < 0 && local_118.m_data != (double *)0x0) {
            pcVar14 = 
            "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Level = 0]"
            ;
LAB_0014441e:
            __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/MapBase.h"
                          ,0xb2,pcVar14);
          }
          if (local_118.m_cols <= lVar15) {
            pcVar14 = 
            "Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
            ;
LAB_001443e0:
            __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/Block.h"
                          ,0x7a,pcVar14);
          }
          if (local_118.m_rows != local_d0) {
            pcVar14 = 
            "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>]"
            ;
LAB_001443ff:
            __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow to resize.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/DenseBase.h"
                          ,0x106,pcVar14);
          }
          uVar16 = local_118.m_rows;
          if ((((ulong)(local_118.m_data + local_118.m_rows * lVar15) & 7) == 0) &&
             (uVar16 = (ulong)((uint)((ulong)(local_118.m_data + local_118.m_rows * lVar15) >> 3) &
                              1), local_118.m_rows <= (long)uVar16)) {
            uVar16 = local_118.m_rows;
          }
          if (0 < (long)uVar16) {
            uVar20 = 0;
            do {
              *(undefined8 *)((long)local_118.m_data + uVar20 * 8 + local_118.m_rows * lVar17) =
                   *(undefined8 *)((long)local_d8 + uVar20 * 8);
              uVar20 = uVar20 + 1;
            } while (uVar16 != uVar20);
          }
          lVar21 = local_118.m_rows - uVar16;
          uVar20 = (lVar21 - (lVar21 >> 0x3f) & 0xfffffffffffffffeU) + uVar16;
          if (1 < lVar21) {
            do {
              puVar13 = (undefined8 *)((long)local_d8 + uVar16 * 8);
              uVar8 = puVar13[1];
              puVar2 = (undefined8 *)
                       ((long)local_118.m_data + uVar16 * 8 + local_118.m_rows * lVar17);
              *puVar2 = *puVar13;
              puVar2[1] = uVar8;
              uVar16 = uVar16 + 2;
            } while ((long)uVar16 < (long)uVar20);
          }
          if ((long)uVar20 < local_118.m_rows) {
            do {
              *(undefined8 *)((long)local_118.m_data + uVar20 * 8 + local_118.m_rows * lVar17) =
                   *(undefined8 *)((long)local_d8 + uVar20 * 8);
              uVar20 = uVar20 + 1;
            } while (local_118.m_rows != uVar20);
          }
          if (local_e0 == (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>)0x1) {
            free(local_d8);
          }
          lVar15 = lVar15 + 1;
          lVar17 = lVar17 + 8;
        } while (lVar15 < (long)uStack_c0);
      }
      free(local_a0);
      IVar10 = local_118.m_cols;
      IVar9 = local_118.m_rows;
      iVar12 = (*((this->core_impl)._M_t.
                  super___uniq_ptr_impl<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_ear::PolarExtentCore_*,_std::default_delete<ear::PolarExtentCore>_>
                  .super__Head_base<0UL,_ear::PolarExtentCore_*,_false>._M_head_impl)->
                 _vptr_PolarExtentCore[3])();
      uVar16 = CONCAT44(extraout_var,iVar12);
      (this->ctx).real_num_speakers = IVar9;
      uVar20 = (uVar16 + IVar9) - 1;
      (this->ctx).num_speakers = uVar20 - uVar20 % uVar16;
      uVar25 = (uVar16 + IVar10) - 1;
      sVar22 = uVar25 - uVar25 % uVar16;
      (this->ctx).num_points = sVar22;
      iVar12 = (*((this->core_impl)._M_t.
                  super___uniq_ptr_impl<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_ear::PolarExtentCore_*,_std::default_delete<ear::PolarExtentCore>_>
                  .super__Head_base<0UL,_ear::PolarExtentCore_*,_false>._M_head_impl)->
                 _vptr_PolarExtentCore[2])();
      uVar20 = CONCAT44(extraout_var_00,iVar12);
      if ((uVar20 & uVar20 - 1) != 0) {
LAB_001444e7:
        __assert_fail("((alignment & (alignment - 1)) == 0) && \"alignment must be a power of two\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/xsimd/include/xsimd/memory/xsimd_aligned_allocator.hpp"
                      ,0x11a,"void *xsimd::detail::xaligned_malloc(size_t, size_t)");
      }
      if (7 < uVar20) {
        sVar23 = sVar22 * 4;
        local_c8 = (extent_float_t *)0x0;
        iVar12 = posix_memalign(&local_c8,uVar20,sVar23);
        peVar24 = (extent_float_t *)0x0;
        if (iVar12 == 0) {
          peVar24 = local_c8;
        }
        if (uVar25 != uVar25 % uVar16) {
          memset(peVar24,0,sVar23);
        }
        (this->ctx).xs = peVar24;
        sVar22 = (this->ctx).num_points;
        iVar12 = (*((this->core_impl)._M_t.
                    super___uniq_ptr_impl<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_ear::PolarExtentCore_*,_std::default_delete<ear::PolarExtentCore>_>
                    .super__Head_base<0UL,_ear::PolarExtentCore_*,_false>._M_head_impl)->
                   _vptr_PolarExtentCore[2])();
        uVar20 = CONCAT44(extraout_var_01,iVar12);
        if ((uVar20 & uVar20 - 1) != 0) goto LAB_001444e7;
        if (7 < uVar20) {
          sVar23 = sVar22 * 4;
          local_c8 = (extent_float_t *)0x0;
          iVar12 = posix_memalign(&local_c8,uVar20,sVar23);
          peVar24 = (extent_float_t *)0x0;
          if (iVar12 == 0) {
            peVar24 = local_c8;
          }
          if (sVar22 != 0) {
            memset(peVar24,0,sVar23);
          }
          (this->ctx).ys = peVar24;
          sVar22 = (this->ctx).num_points;
          iVar12 = (*((this->core_impl)._M_t.
                      super___uniq_ptr_impl<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ear::PolarExtentCore_*,_std::default_delete<ear::PolarExtentCore>_>
                      .super__Head_base<0UL,_ear::PolarExtentCore_*,_false>._M_head_impl)->
                     _vptr_PolarExtentCore[2])();
          uVar20 = CONCAT44(extraout_var_02,iVar12);
          if ((uVar20 & uVar20 - 1) != 0) goto LAB_001444e7;
          if (7 < uVar20) {
            sVar23 = sVar22 * 4;
            local_c8 = (extent_float_t *)0x0;
            iVar12 = posix_memalign(&local_c8,uVar20,sVar23);
            peVar24 = (extent_float_t *)0x0;
            if (iVar12 == 0) {
              peVar24 = local_c8;
            }
            if (sVar22 != 0) {
              memset(peVar24,0,sVar23);
            }
            (this->ctx).zs = peVar24;
            lVar17 = (this->ctx).num_speakers * (this->ctx).num_points;
            iVar12 = (*((this->core_impl)._M_t.
                        super___uniq_ptr_impl<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_ear::PolarExtentCore_*,_std::default_delete<ear::PolarExtentCore>_>
                        .super__Head_base<0UL,_ear::PolarExtentCore_*,_false>._M_head_impl)->
                       _vptr_PolarExtentCore[2])();
            uVar20 = CONCAT44(extraout_var_03,iVar12);
            if ((uVar20 & uVar20 - 1) != 0) goto LAB_001444e7;
            if (7 < uVar20) {
              sVar23 = lVar17 * 4;
              local_c8 = (extent_float_t *)0x0;
              iVar12 = posix_memalign(&local_c8,uVar20,sVar23);
              peVar24 = (extent_float_t *)0x0;
              if (iVar12 == 0) {
                peVar24 = local_c8;
              }
              if (lVar17 != 0) {
                memset(peVar24,0,sVar23);
              }
              (this->ctx).panning_results = peVar24;
              lVar17 = ((this->ctx).num_points / uVar16) * (this->ctx).num_speakers;
              iVar12 = (*((this->core_impl)._M_t.
                          super___uniq_ptr_impl<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_ear::PolarExtentCore_*,_std::default_delete<ear::PolarExtentCore>_>
                          .super__Head_base<0UL,_ear::PolarExtentCore_*,_false>._M_head_impl)->
                         _vptr_PolarExtentCore[2])();
              uVar20 = CONCAT44(extraout_var_04,iVar12);
              if ((uVar20 & uVar20 - 1) != 0) goto LAB_001444e7;
              if (7 < uVar20) {
                sVar23 = lVar17 * 4;
                local_c8 = (extent_float_t *)0x0;
                iVar12 = posix_memalign(&local_c8,uVar20,sVar23);
                peVar24 = (extent_float_t *)0x0;
                if (iVar12 == 0) {
                  peVar24 = local_c8;
                }
                if (lVar17 != 0) {
                  memset(peVar24,0,sVar23);
                }
                (this->ctx).summed_panning_results = peVar24;
                sVar22 = (this->ctx).num_speakers;
                iVar12 = (*((this->core_impl)._M_t.
                            super___uniq_ptr_impl<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_ear::PolarExtentCore_*,_std::default_delete<ear::PolarExtentCore>_>
                            .super__Head_base<0UL,_ear::PolarExtentCore_*,_false>._M_head_impl)->
                           _vptr_PolarExtentCore[2])();
                uVar20 = CONCAT44(extraout_var_05,iVar12);
                if ((uVar20 & uVar20 - 1) != 0) goto LAB_001444e7;
                if (7 < uVar20) {
                  sVar23 = sVar22 * 4;
                  local_c8 = (extent_float_t *)0x0;
                  iVar12 = posix_memalign(&local_c8,uVar20,sVar23);
                  peVar24 = (extent_float_t *)0x0;
                  if (iVar12 == 0) {
                    peVar24 = local_c8;
                  }
                  if (sVar22 != 0) {
                    memset(peVar24,0,sVar23);
                  }
                  (this->ctx).results = peVar24;
                  if (IVar10 != 0) {
                    local_68 = (this->ctx).xs;
                    local_f0 = (VectorXd *)(this->ctx).ys;
                    local_f8 = (VectorXd *)((long)local_130 + lStack_128 * 8);
                    local_e8 = local_130;
                    local_38 = (void *)(lStack_128 * 0x10 + (long)local_130);
                    local_40 = (this->ctx).zs;
                    local_50 = local_118.m_rows * 8;
                    lVar17 = 0;
                    lVar15 = 0;
                    uVar20 = 0;
                    local_48 = IVar10;
                    do {
                      if ((((lStack_128 <= (long)uVar20) || ((long)local_120 < 1)) ||
                          (local_68[uVar20] = (float)*(double *)((long)local_130 + uVar20 * 8),
                          local_120 == 1)) ||
                         (*(float *)((long)&(local_f0->
                                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                            ).m_storage.m_data + uVar20 * 4) =
                               (float)(double)(&(local_f8->
                                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                ).m_storage.m_data)[uVar20], local_120 < 3))
                      goto LAB_001443ac;
                      local_40[uVar20] = (float)*(double *)((long)local_38 + uVar20 * 8);
                      if (IVar9 != 0) {
                        peVar24 = (this->ctx).summed_panning_results;
                        sVar22 = (this->ctx).num_points;
                        sVar4 = (this->ctx).num_speakers;
                        pfVar19 = (float *)((long)(this->ctx).panning_results + lVar15);
                        uVar25 = 0;
                        do {
                          if ((local_118.m_rows <= (long)uVar25) ||
                             (local_118.m_cols <= (long)uVar20)) goto LAB_001443ac;
                          fVar26 = (float)*(double *)((long)local_118.m_data + uVar25 * 8 + lVar17);
                          *pfVar19 = fVar26;
                          lVar21 = (uVar20 / uVar16) * sVar4;
                          peVar24[lVar21 + uVar25] = fVar26 + peVar24[lVar21 + uVar25];
                          uVar25 = uVar25 + 1;
                          pfVar19 = pfVar19 + sVar22;
                        } while (IVar9 != uVar25);
                      }
                      uVar20 = uVar20 + 1;
                      lVar15 = lVar15 + 4;
                      lVar17 = lVar17 + local_50;
                    } while (uVar20 != IVar10);
                  }
                  uVar16 = (this->ctx).num_points;
                  if ((ulong)IVar10 < uVar16) {
                    if ((((long)(IVar10 - 1U) < 0) || (lStack_128 <= (long)(IVar10 - 1U))) ||
                       ((long)local_120 < 1)) {
LAB_001443ac:
                      __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/DenseCoeffsBase.h"
                                    ,0x16f,
                                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                                   );
                    }
                    peVar24 = (this->ctx).xs;
                    peVar5 = (this->ctx).ys;
                    peVar6 = (this->ctx).zs;
                    dVar7 = *(double *)((long)local_130 + IVar10 * 8 + -8);
                    uVar20 = IVar10;
                    do {
                      peVar24[uVar20] = (float)dVar7;
                      if ((local_120 == 1) ||
                         (peVar5[uVar20] =
                               (float)*(double *)
                                       ((long)local_130 + IVar10 * 8 + lStack_128 * 8 + -8),
                         local_120 < 3)) goto LAB_001443ac;
                      peVar6[uVar20] =
                           (float)*(double *)((long)local_130 + IVar10 * 8 + lStack_128 * 0x10 + -8)
                      ;
                      uVar20 = uVar20 + 1;
                    } while (uVar16 != uVar20);
                  }
                  free(local_118.m_data);
                  free(local_130);
                  return;
                }
              }
            }
          }
        }
      }
      __assert_fail("(alignment >= sizeof(void*)) && \"alignment must be at least the size of a pointer\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/xsimd/include/xsimd/memory/xsimd_aligned_allocator.hpp"
                    ,0x11b,"void *xsimd::detail::xaligned_malloc(size_t, size_t)");
    }
  }
  __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/PlainObjectBase.h"
                ,0x130,
                "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

PolarExtent::PolarExtent(const std::shared_ptr<PointSourcePanner> &psp_,
                           std::unique_ptr<PolarExtentCore> core_impl_)
      : core_impl(std::move(core_impl_)),
        psp(psp_),
        pvsMin(psp->numberOfOutputChannels()),
        pvsMax(psp->numberOfOutputChannels()) {
    auto panning_positions = generatePanningPositionsEven(nRows);
    auto panning_results =
        generatePanningPositionsResults(psp, panning_positions);

    size_t num_speakers = panning_results.rows();
    size_t num_points = panning_results.cols();
    size_t batch_size = core_impl->batch_size();
    ctx.real_num_speakers = num_speakers;
    ctx.num_speakers = round_up(num_speakers, batch_size);
    ctx.num_points = round_up(num_points, batch_size);

    // use regular malloc and free for memory management. reasoning:
    // - the parts compiled with different architectures should not use any
    //   in-line functions which could get merged; therefore using any kind of
    //   smart pointer in the interface is a bad plan
    // - we could use a smart pointer and extract a float pointer, but that
    //   doesn't make it much cleaner, would still break copying, and would
    //   ultimately be more code
    // - using smart pointers would be awkward anyway, as the alignment is
    //   known at run-time
    auto malloc_float = [&](size_t n) {
      auto mem = (extent_float_t *)xsimd::aligned_malloc(
          sizeof(extent_float_t) * n, core_impl->alignment());
      for (size_t i = 0; i < n; i++) mem[i] = 0.0;
      return mem;
    };

    ctx.xs = malloc_float(ctx.num_points);
    ctx.ys = malloc_float(ctx.num_points);
    ctx.zs = malloc_float(ctx.num_points);

    ctx.panning_results = malloc_float(ctx.num_points * ctx.num_speakers);
    size_t num_batches = ctx.num_points / batch_size;
    ctx.summed_panning_results = malloc_float(num_batches * ctx.num_speakers);

    ctx.results = malloc_float(ctx.num_speakers);

    for (size_t p = 0; p < num_points; p++) {
      ctx.xs[p] = static_cast<extent_float_t>(panning_positions(p, 0));
      ctx.ys[p] = static_cast<extent_float_t>(panning_positions(p, 1));
      ctx.zs[p] = static_cast<extent_float_t>(panning_positions(p, 2));

      for (size_t s = 0; s < num_speakers; s++) {
        ctx.panning_results[s * ctx.num_points + p] =
            static_cast<extent_float_t>(panning_results(s, p));
        size_t batch = p / batch_size;
        ctx.summed_panning_results[batch * ctx.num_speakers + s] +=
            static_cast<extent_float_t>(panning_results(s, p));
      }
    }

    for (size_t p = num_points; p < ctx.num_points; p++) {
      // the results of these will be ignored; make them consistent with the
      // rest of the batch
      ctx.xs[p] =
          static_cast<extent_float_t>(panning_positions(num_points - 1, 0));
      ctx.ys[p] =
          static_cast<extent_float_t>(panning_positions(num_points - 1, 1));
      ctx.zs[p] =
          static_cast<extent_float_t>(panning_positions(num_points - 1, 2));
    }
  }